

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_func_setup(jit_State *J)

{
  jit_State *J_00;
  uint uVar1;
  uint uVar2;
  long in_RDI;
  BCReg numparams;
  BCReg s;
  GCproto *pt;
  TraceError in_stack_ffffffffffffffec;
  
  J_00 = *(jit_State **)(in_RDI + 0x78);
  uVar1 = (uint)(J_00->cur).topslot;
  if (((ulong)(J_00->cur).snap & 0x80000000000) != 0) {
    lj_trace_err(J_00,in_stack_ffffffffffffffec);
  }
  if (0xf9 < *(int *)(in_RDI + 0x90) + (uint)(J_00->cur).linktype) {
    lj_trace_err(J_00,in_stack_ffffffffffffffec);
  }
  for (uVar2 = *(uint *)(in_RDI + 0x8c); uVar2 < uVar1; uVar2 = uVar2 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x80) + (ulong)uVar2 * 4) = 0x7fff;
  }
  *(uint *)(in_RDI + 0x8c) = uVar1;
  return;
}

Assistant:

static void rec_func_setup(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, numparams = pt->numparams;
  if ((pt->flags & PROTO_NOJIT))
    lj_trace_err(J, LJ_TRERR_CJITOFF);
  if (J->baseslot + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  /* Fill up missing parameters with nil. */
  for (s = J->maxslot; s < numparams; s++)
    J->base[s] = TREF_NIL;
  /* The remaining slots should never be read before they are written. */
  J->maxslot = numparams;
}